

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  undefined1 local_c41;
  undefined1 local_c40;
  undefined1 local_c3f;
  allocator local_c3e;
  allocator local_c3d;
  int local_c3c [3];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_c30;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_c08;
  undefined1 local_be0 [56];
  undefined1 local_ba8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b90;
  EitherFlag local_b80;
  string local_b58;
  string local_b38;
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  pos;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  b;
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
  m;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  f;
  CompletionFlag c;
  ArgumentParser p;
  
  std::__cxx11::string::string((string *)&f,"parser",(allocator *)&m);
  b.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&b.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  b.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.options = None;
  b.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched = false;
  b.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._13_3_ = 0;
  b.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p._0_1_ = 0;
  args::ArgumentParser::ArgumentParser(&p,(string *)&f,(string *)&b);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::~string((string *)&f);
  args::EitherFlag::EitherFlag((EitherFlag *)&b,"complete");
  in._M_len = 1;
  in._M_array = (iterator)&b;
  args::Matcher::Matcher((Matcher *)&f,in);
  args::CompletionFlag::CompletionFlag<args::ArgumentParser>(&c,&p,(Matcher *)&f);
  args::Matcher::~Matcher((Matcher *)&f);
  std::__cxx11::string::~string
            ((string *)&b.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.options);
  std::__cxx11::string::string((string *)&pos,"name",(allocator *)local_be0);
  std::__cxx11::string::string((string *)local_ba8,"description",(allocator *)&local_b38);
  m.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ =
       &m.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length;
  m.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x6601;
  m.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
       (pointer)0x0;
  m.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length._0_1_ = 0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)
             ((long)&m.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help.field_2 +
             8),"foo");
  in_00._M_len = 2;
  in_00._M_array = (iterator)&m;
  args::Matcher::Matcher((Matcher *)&b,in_00);
  std::__cxx11::string::string((string *)&local_c30,"abc",(allocator *)&local_b58);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag(&f,(Group *)&p,(string *)&pos,(string *)local_ba8,(Matcher *)&b,&local_c30.first,None)
  ;
  std::__cxx11::string::~string((string *)&local_c30);
  args::Matcher::~Matcher((Matcher *)&b);
  lVar1 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&m.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base +
               lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)local_ba8);
  std::__cxx11::string::~string((string *)&pos);
  std::__cxx11::string::string((string *)local_ba8,"name",(allocator *)&local_b38);
  std::__cxx11::string::string((string *)&local_c30,"description",(allocator *)&local_b58);
  pos.super_PositionalBase.super_NamedBase.super_Base._8_8_ =
       &pos.super_PositionalBase.super_NamedBase.super_Base.help._M_string_length;
  pos.super_PositionalBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x6201;
  pos.super_PositionalBase.super_NamedBase.super_Base.help._M_dataplus._M_p = (pointer)0x0;
  pos.super_PositionalBase.super_NamedBase.super_Base.help._M_string_length._0_1_ = 0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)
             ((long)&pos.super_PositionalBase.super_NamedBase.super_Base.help.field_2 + 8),"bar");
  in_01._M_len = 2;
  in_01._M_array = (iterator)&pos;
  args::Matcher::Matcher((Matcher *)&m,in_01);
  std::__cxx11::string::string((string *)local_be0,"abc",(allocator *)local_c3c);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag(&b,(Group *)&p,(string *)local_ba8,&local_c30.first,(Matcher *)&m,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be0,None);
  std::__cxx11::string::~string((string *)local_be0);
  args::Matcher::~Matcher((Matcher *)&m);
  lVar1 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&pos.super_PositionalBase.super_NamedBase.super_Base._vptr_Base + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string((string *)local_ba8);
  std::__cxx11::string::string((string *)&local_b38,"mappos",&local_c3d);
  std::__cxx11::string::string((string *)&local_b58,"mappos",&local_c3e);
  local_ba8._8_8_ = &local_b90;
  local_ba8[0] = true;
  local_ba8[1] = 'm';
  local_ba8._16_8_ = 0;
  local_b90._M_local_buf[0] = '\0';
  args::EitherFlag::EitherFlag(&local_b80,"map");
  in_02._M_len = 2;
  in_02._M_array = (iterator)local_ba8;
  args::Matcher::Matcher((Matcher *)&pos,in_02);
  local_c3c[0] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[2],_int,_true>(&local_c30,(char (*) [2])"1",local_c3c);
  local_c3c[2] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[2],_int,_true>(&local_c08,(char (*) [2])"2",local_c3c + 2);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,int>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_be0,&local_c30,local_be0,0,&local_c3f,&local_c40,&local_c41);
  local_c3c[1] = 0;
  args::
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
  ::MapFlag(&m,(Group *)&p,&local_b38,&local_b58,(Matcher *)&pos,
            (unordered_map<std::__cxx11::basic_string<char>,_int> *)local_be0,local_c3c + 1,None);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_be0);
  lVar1 = 0x28;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c30.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  args::Matcher::~Matcher((Matcher *)&pos);
  lVar1 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_ba8 + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::string((string *)local_ba8,"name",(allocator *)&local_b38);
  std::__cxx11::string::string((string *)&local_c30,"desc",(allocator *)&local_b58);
  local_be0._0_8_ = local_be0 + 0x10;
  local_be0._8_8_ = 0;
  local_be0[0x10] = '\0';
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::Positional(&pos,(Group *)&p,(string *)local_ba8,&local_c30.first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be0,None);
  std::__cxx11::string::~string((string *)local_be0);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string((string *)local_ba8);
  args::ArgumentParser::ParseCLI(&p,argc,argv);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~Positional(&pos);
  args::
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
  ::~MapFlag(&m);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag(&b);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag(&f);
  args::CompletionFlag::~CompletionFlag(&c);
  args::ArgumentParser::~ArgumentParser(&p);
  return 0;
}

Assistant:

int main(int argc, const char **argv)
{
    args::ArgumentParser p("parser");
    args::CompletionFlag c(p, {"complete"});
    args::ValueFlag<std::string> f(p, "name", "description", {'f', "foo"}, "abc");
    args::ValueFlag<std::string> b(p, "name", "description", {'b', "bar"}, "abc");
    args::MapFlag<std::string, int> m(p, "mappos", "mappos", {'m', "map"}, {{"1",1}, {"2", 2}});
    args::Positional<std::string> pos(p, "name", "desc");

    try
    {
        p.ParseCLI(argc, argv);
    }
    catch (args::Completion &e)
    {
        std::cout << e.what();
    }

    return 0;
}